

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O2

void __thiscall CFGsContainer::dumpAll(CFGsContainer *this,char *directory)

{
  CFG *this_00;
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  for (p_Var2 = (this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    this_00 = (CFG *)p_Var2[1]._M_parent;
    if (this_00->m_status == VALID) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar1 = std::operator<<(local_1a8,directory);
      poVar1 = std::operator<<(poVar1,"/cfg");
      poVar1 = std::operator<<(poVar1,(string *)&this->m_name);
      poVar1 = std::operator<<(poVar1,"-0x");
      *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
           *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar1,".dot");
      std::__cxx11::stringbuf::str();
      CFG::dumpDOT(this_00,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
    }
  }
  return;
}

Assistant:

void CFGsContainer::dumpAll(const char* directory) {
	for (std::map<Addr, CFG*>::iterator it = m_cfgsMap.begin(),
			ed = m_cfgsMap.end(); it != ed; it++) {
		CFG* cfg = it->second;
		if (cfg->status() != CFG::VALID)
			continue;

		std::stringstream ss;
		ss << directory << "/cfg" << m_name << "-0x" << std::hex << cfg->addr() << ".dot";
		cfg->dumpDOT(ss.str());
	}
}